

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Resume * __thiscall
wasm::Builder::makeResume
          (Builder *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *handlerTags,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *handlerBlocks,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *sentTypes,ExpressionList *operands,
          Expression *cont)

{
  Expression **ppEVar1;
  size_t sVar2;
  Resume *this_00;
  MixedArena *this_01;
  
  this_01 = &this->wasm->allocator;
  this_00 = (Resume *)MixedArena::allocSpace(this_01,0x98,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)93>).super_Expression._id = ResumeId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)93>).super_Expression.type.id = 0;
  (this_00->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
       (Name *)0x0;
  (this_00->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0
  ;
  (this_00->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
  allocatedElements = 0;
  (this_00->handlerTags).allocator = this_01;
  (this_00->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
       (Name *)0x0;
  (this_00->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements =
       0;
  (this_00->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
  allocatedElements = 0;
  (this_00->handlerBlocks).allocator = this_01;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_00->operands).allocator = this_01;
  (this_00->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data = (Type *)0x0
  ;
  (this_00->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
  (this_00->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements
       = 0;
  (this_00->sentTypes).allocator = this_01;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&this_00->handlerTags,
             handlerTags);
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&this_00->handlerBlocks,
             handlerBlocks);
  ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type>::
  set<std::vector<wasm::Type,std::allocator<wasm::Type>>>
            ((ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type> *)&this_00->sentTypes,sentTypes);
  if (&this_00->operands != operands) {
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    ppEVar1 = (this_00->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    data = (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
           data;
    (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data =
         ppEVar1;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = (operands->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                   usedElements;
    (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
    usedElements = 0;
    sVar2 = (this_00->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            allocatedElements;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements =
         (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
         allocatedElements;
    (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
    allocatedElements = sVar2;
  }
  this_00->cont = cont;
  Resume::finalize(this_00);
  return this_00;
}

Assistant:

Resume* makeResume(const std::vector<Name>& handlerTags,
                     const std::vector<Name>& handlerBlocks,
                     const std::vector<Type>& sentTypes,
                     ExpressionList&& operands,
                     Expression* cont) {
    auto* ret = wasm.allocator.alloc<Resume>();
    ret->handlerTags.set(handlerTags);
    ret->handlerBlocks.set(handlerBlocks);
    ret->sentTypes.set(sentTypes);
    ret->operands = std::move(operands);
    ret->cont = cont;
    ret->finalize();
    return ret;
  }